

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O1

string * __thiscall
glcts::TessellationShaderError7::getTessellationEvaluationShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderError7 *this,uint n_program_object)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (quads) in;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n}\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderError7::getTessellationEvaluationShaderCode(unsigned int n_program_object)
{
	DE_UNREF(n_program_object);

	return "${VERSION}\n"
		   "\n"
		   "${TESSELLATION_SHADER_REQUIRE}\n"
		   "\n"
		   "layout (quads) in;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    gl_Position = gl_in[0].gl_Position;\n"
		   "}\n";
}